

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

ushort __thiscall
Memory::ValidPointers<SmallAllocationBlockAttributes>::GetAddressIndex
          (ValidPointers<SmallAllocationBlockAttributes> *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (0xff < index) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x34,"(index < TBlockAttributes::MaxSmallObjectCount)",
                       "index < TBlockAttributes::MaxSmallObjectCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return this->validPointers[index];
}

Assistant:

ushort ValidPointers<TBlockAttributes>::GetAddressIndex(uint index) const
{
    Assert(index < TBlockAttributes::MaxSmallObjectCount);
#if USE_VPM_TABLE    
    return validPointers[index];
#else
    return CalculateAddressIndex(index, indexPerObject, maxObjectIndex);
#endif
    
}